

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

void xmlValidateRef(xmlRefPtr ref,xmlValidCtxtPtr ctxt,xmlChar *name)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  xmlAttrPtr pxVar4;
  xmlAttrPtr pxVar5;
  bool bVar6;
  byte *pbStack_68;
  xmlChar save_1;
  xmlChar *cur_1;
  xmlChar *str_1;
  xmlChar *dup_1;
  byte *pbStack_48;
  xmlChar save;
  xmlChar *cur;
  xmlChar *str;
  xmlChar *dup;
  xmlAttrPtr attr;
  xmlAttrPtr id;
  xmlChar *name_local;
  xmlValidCtxtPtr ctxt_local;
  xmlRefPtr ref_local;
  
  if ((ref != (xmlRefPtr)0x0) && ((ref->attr != (xmlAttrPtr)0x0 || (ref->name != (xmlChar *)0x0))))
  {
    pxVar4 = ref->attr;
    if (pxVar4 == (xmlAttrPtr)0x0) {
      pbVar3 = xmlStrdup(name);
      pbStack_48 = pbVar3;
      if (pbVar3 == (byte *)0x0) {
        xmlVErrMemory(ctxt);
      }
      else {
        while (pbVar2 = pbStack_48, *pbStack_48 != 0) {
          while( true ) {
            bVar6 = false;
            if (*pbStack_48 != 0) {
              bVar6 = true;
              if ((*pbStack_48 != 0x20) && ((*pbStack_48 < 9 || (bVar6 = true, 10 < *pbStack_48))))
              {
                bVar6 = *pbStack_48 == 0xd;
              }
              bVar6 = (bool)(bVar6 ^ 1);
            }
            if (!bVar6) break;
            pbStack_48 = pbStack_48 + 1;
          }
          bVar1 = *pbStack_48;
          *pbStack_48 = 0;
          pxVar4 = xmlGetID(ctxt->doc,pbVar2);
          if (pxVar4 == (xmlAttrPtr)0x0) {
            xmlErrValidNodeNr(ctxt,(xmlNodePtr)0x0,XML_DTD_UNKNOWN_ID,
                              "attribute %s line %d references an unknown ID \"%s\"\n",ref->name,
                              ref->lineno,pbVar2);
            ctxt->valid = 0;
          }
          if (bVar1 == 0) break;
          *pbStack_48 = bVar1;
          while( true ) {
            bVar6 = true;
            if ((*pbStack_48 != 0x20) && ((*pbStack_48 < 9 || (bVar6 = true, 10 < *pbStack_48)))) {
              bVar6 = *pbStack_48 == 0xd;
            }
            if (!bVar6) break;
            pbStack_48 = pbStack_48 + 1;
          }
        }
        (*xmlFree)(pbVar3);
      }
    }
    else if (pxVar4->atype == XML_ATTRIBUTE_IDREF) {
      pxVar5 = xmlGetID(ctxt->doc,name);
      if (pxVar5 == (xmlAttrPtr)0x0) {
        xmlErrValidNode(ctxt,pxVar4->parent,XML_DTD_UNKNOWN_ID,
                        "IDREF attribute %s references an unknown ID \"%s\"\n",pxVar4->name,name,
                        (xmlChar *)0x0);
        ctxt->valid = 0;
      }
    }
    else if (pxVar4->atype == XML_ATTRIBUTE_IDREFS) {
      pbVar3 = xmlStrdup(name);
      pbStack_68 = pbVar3;
      if (pbVar3 == (byte *)0x0) {
        xmlVErrMemory(ctxt);
        ctxt->valid = 0;
      }
      else {
        while (pbVar2 = pbStack_68, *pbStack_68 != 0) {
          while( true ) {
            bVar6 = false;
            if (*pbStack_68 != 0) {
              bVar6 = true;
              if ((*pbStack_68 != 0x20) && ((*pbStack_68 < 9 || (bVar6 = true, 10 < *pbStack_68))))
              {
                bVar6 = *pbStack_68 == 0xd;
              }
              bVar6 = (bool)(bVar6 ^ 1);
            }
            if (!bVar6) break;
            pbStack_68 = pbStack_68 + 1;
          }
          bVar1 = *pbStack_68;
          *pbStack_68 = 0;
          pxVar5 = xmlGetID(ctxt->doc,pbVar2);
          if (pxVar5 == (xmlAttrPtr)0x0) {
            xmlErrValidNode(ctxt,pxVar4->parent,XML_DTD_UNKNOWN_ID,
                            "IDREFS attribute %s references an unknown ID \"%s\"\n",pxVar4->name,
                            pbVar2,(xmlChar *)0x0);
            ctxt->valid = 0;
          }
          if (bVar1 == 0) break;
          *pbStack_68 = bVar1;
          while( true ) {
            bVar6 = true;
            if ((*pbStack_68 != 0x20) && ((*pbStack_68 < 9 || (bVar6 = true, 10 < *pbStack_68)))) {
              bVar6 = *pbStack_68 == 0xd;
            }
            if (!bVar6) break;
            pbStack_68 = pbStack_68 + 1;
          }
        }
        (*xmlFree)(pbVar3);
      }
    }
  }
  return;
}

Assistant:

static void
xmlValidateRef(xmlRefPtr ref, xmlValidCtxtPtr ctxt,
	                   const xmlChar *name) {
    xmlAttrPtr id;
    xmlAttrPtr attr;

    if (ref == NULL)
	return;
    if ((ref->attr == NULL) && (ref->name == NULL))
	return;
    attr = ref->attr;
    if (attr == NULL) {
	xmlChar *dup, *str = NULL, *cur, save;

	dup = xmlStrdup(name);
	if (dup == NULL) {
            xmlVErrMemory(ctxt);
	    return;
	}
	cur = dup;
	while (*cur != 0) {
	    str = cur;
	    while ((*cur != 0) && (!IS_BLANK_CH(*cur))) cur++;
	    save = *cur;
	    *cur = 0;
	    id = xmlGetID(ctxt->doc, str);
	    if (id == NULL) {
		xmlErrValidNodeNr(ctxt, NULL, XML_DTD_UNKNOWN_ID,
	   "attribute %s line %d references an unknown ID \"%s\"\n",
		       ref->name, ref->lineno, str);
		ctxt->valid = 0;
	    }
	    if (save == 0)
		break;
	    *cur = save;
	    while (IS_BLANK_CH(*cur)) cur++;
	}
	xmlFree(dup);
    } else if (attr->atype == XML_ATTRIBUTE_IDREF) {
	id = xmlGetID(ctxt->doc, name);
	if (id == NULL) {
	    xmlErrValidNode(ctxt, attr->parent, XML_DTD_UNKNOWN_ID,
	   "IDREF attribute %s references an unknown ID \"%s\"\n",
		   attr->name, name, NULL);
	    ctxt->valid = 0;
	}
    } else if (attr->atype == XML_ATTRIBUTE_IDREFS) {
	xmlChar *dup, *str = NULL, *cur, save;

	dup = xmlStrdup(name);
	if (dup == NULL) {
	    xmlVErrMemory(ctxt);
	    ctxt->valid = 0;
	    return;
	}
	cur = dup;
	while (*cur != 0) {
	    str = cur;
	    while ((*cur != 0) && (!IS_BLANK_CH(*cur))) cur++;
	    save = *cur;
	    *cur = 0;
	    id = xmlGetID(ctxt->doc, str);
	    if (id == NULL) {
		xmlErrValidNode(ctxt, attr->parent, XML_DTD_UNKNOWN_ID,
	   "IDREFS attribute %s references an unknown ID \"%s\"\n",
			     attr->name, str, NULL);
		ctxt->valid = 0;
	    }
	    if (save == 0)
		break;
	    *cur = save;
	    while (IS_BLANK_CH(*cur)) cur++;
	}
	xmlFree(dup);
    }
}